

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool anon_unknown.dwarf_3e3c5b::ExpandMacros
               (cmCMakePresetsGraph *graph,PackagePreset *preset,
               optional<cmCMakePresetsGraph::PackagePreset> *out,
               vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *macroExpanders)

{
  bool bVar1;
  int iVar2;
  ExpandMacroResult EVar3;
  PackagePreset *pPVar4;
  reference ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *macroExpanders_local;
  optional<cmCMakePresetsGraph::PackagePreset> *out_local;
  PackagePreset *preset_local;
  cmCMakePresetsGraph *graph_local;
  
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&pPVar4->Variables);
  variable = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&pPVar4->Variables);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&variable), bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
    EVar3 = ExpandMacros(&ppVar5->second,macroExpanders,iVar2);
    if (EVar3 != Ok) {
      if (EVar3 == Ignore) {
        std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
        return true;
      }
      if (EVar3 == Error) {
        return false;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
  EVar3 = ExpandMacros(&pPVar4->ConfigFile,macroExpanders,iVar2);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
      return true;
    }
    if (EVar3 == Error) {
      return false;
    }
  }
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
  EVar3 = ExpandMacros(&pPVar4->PackageName,macroExpanders,iVar2);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
      return true;
    }
    if (EVar3 == Error) {
      return false;
    }
  }
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
  EVar3 = ExpandMacros(&pPVar4->PackageVersion,macroExpanders,iVar2);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
      return true;
    }
    if (EVar3 == Error) {
      return false;
    }
  }
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
  EVar3 = ExpandMacros(&pPVar4->PackageDirectory,macroExpanders,iVar2);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
      return true;
    }
    if (EVar3 == Error) {
      return false;
    }
  }
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->(out);
  iVar2 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
  EVar3 = ExpandMacros(&pPVar4->VendorName,macroExpanders,iVar2);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset(out);
      return true;
    }
    if (EVar3 == Error) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph,
                  const PackagePreset& preset,
                  cm::optional<PackagePreset>& out,
                  const std::vector<MacroExpander>& macroExpanders)
{
  for (auto& variable : out->Variables) {
    CHECK_EXPAND(out, variable.second, macroExpanders,
                 graph.GetVersion(preset));
  }

  CHECK_EXPAND(out, out->ConfigFile, macroExpanders, graph.GetVersion(preset));
  CHECK_EXPAND(out, out->PackageName, macroExpanders,
               graph.GetVersion(preset));
  CHECK_EXPAND(out, out->PackageVersion, macroExpanders,
               graph.GetVersion(preset));
  CHECK_EXPAND(out, out->PackageDirectory, macroExpanders,
               graph.GetVersion(preset));
  CHECK_EXPAND(out, out->VendorName, macroExpanders, graph.GetVersion(preset));

  return true;
}